

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManPrintSolutions(Emb_Man_t *p,int nSols)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  
  if (nSols < 1) {
    nSols = 0;
  }
  for (iVar5 = 0; iVar5 != nSols; iVar5 = iVar5 + 1) {
    iVar2 = p->nObjs;
    iVar3 = iVar2 * iVar5;
    pfVar1 = p->pSols;
    for (lVar4 = 0; lVar4 < iVar2; lVar4 = lVar4 + 1) {
      printf("%4d ",(ulong)(uint)(int)(pfVar1[iVar3 + lVar4] * 100.0));
      iVar2 = p->nObjs;
    }
    putchar(10);
  }
  return;
}

Assistant:

void Emb_ManPrintSolutions( Emb_Man_t * p, int nSols )
{
    float * pSol;
    int i, k;
    for ( i = 0; i < nSols; i++ )
    {
        pSol = Emb_ManSol( p, i );
        for ( k = 0; k < p->nObjs; k++ )
            printf( "%4d ", (int)(100 * pSol[k]) );
        printf( "\n" );
    }
}